

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

char * LoadFileText(char *fileName)

{
  char *pcVar1;
  FILE *__stream;
  ulong uVar2;
  char *__ptr;
  size_t sVar3;
  int logType;
  uint uVar4;
  
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
    return (char *)0x0;
  }
  if (loadFileText != (LoadFileTextCallback)0x0) {
    pcVar1 = (*loadFileText)(fileName);
    return pcVar1;
  }
  __stream = fopen(fileName,"rt");
  if (__stream == (FILE *)0x0) {
    TraceLog(4,"FILEIO: [%s] Failed to open text file",fileName);
    return (char *)0x0;
  }
  fseek(__stream,0,2);
  uVar2 = ftell(__stream);
  fseek(__stream,0,0);
  uVar4 = (uint)uVar2;
  if (uVar4 == 0) {
    pcVar1 = "FILEIO: [%s] Failed to read text file";
  }
  else {
    __ptr = (char *)malloc((ulong)(uVar4 + 1));
    if (__ptr != (char *)0x0) {
      sVar3 = fread(__ptr,1,uVar2 & 0xffffffff,__stream);
      if ((uint)sVar3 < uVar4) {
        __ptr = (char *)realloc(__ptr,(ulong)((uint)sVar3 + 1));
      }
      __ptr[sVar3 & 0xffffffff] = '\0';
      pcVar1 = "FILEIO: [%s] Text file loaded successfully";
      logType = 3;
      goto LAB_001bbbbb;
    }
    pcVar1 = "FILEIO: [%s] Failed to allocated memory for file reading";
  }
  __ptr = (char *)0x0;
  logType = 4;
LAB_001bbbbb:
  TraceLog(logType,pcVar1,fileName);
  fclose(__stream);
  return __ptr;
}

Assistant:

char *LoadFileText(const char *fileName)
{
    char *text = NULL;

    if (fileName != NULL)
    {
        if (loadFileText)
        {
            text = loadFileText(fileName);
            return text;
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "rt");

        if (file != NULL)
        {
            // WARNING: When reading a file as 'text' file,
            // text mode causes carriage return-linefeed translation...
            // ...but using fseek() should return correct byte-offset
            fseek(file, 0, SEEK_END);
            unsigned int size = (unsigned int)ftell(file);
            fseek(file, 0, SEEK_SET);

            if (size > 0)
            {
                text = (char *)RL_MALLOC((size + 1)*sizeof(char));

                if (text != NULL)
                {
                    unsigned int count = (unsigned int)fread(text, sizeof(char), size, file);

                    // WARNING: \r\n is converted to \n on reading, so,
                    // read bytes count gets reduced by the number of lines
                    if (count < size) text = RL_REALLOC(text, count + 1);

                    // Zero-terminate the string
                    text[count] = '\0';

                    TRACELOG(LOG_INFO, "FILEIO: [%s] Text file loaded successfully", fileName);
                }
                else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to allocated memory for file reading", fileName);
            }
            else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to read text file", fileName);

            fclose(file);
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open text file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return text;
}